

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O3

void __thiscall
http_server::inbound_connection::inbound_connection(inbound_connection *this,http_server *parent)

{
  timer *t;
  undefined8 local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  inbound_connection *local_58;
  undefined8 local_50;
  code *local_48;
  code *local_40;
  sockaddr local_38;
  code *local_28;
  code *local_20;
  
  this->parent = parent;
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_server.cpp:35:32)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_server.cpp:35:32)>
             ::_M_manager;
  local_50 = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_server.cpp:37:8)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_server.cpp:37:8)>
             ::_M_manager;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  local_58 = this;
  local_38._0_8_ = this;
  server_socket::accept
            ((server_socket *)&this->socket,(int)parent + 8,&local_38,(socklen_t *)&local_58);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  t = sysapi::epoll::get_timer(parent->ep);
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_server.cpp:40:46)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_server.cpp:40:46)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  timer_element::timer_element(&this->timer,t,(duration)0x37e11d600,(callback_t *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  this->request_received = 0;
  (this->target)._M_t.super___uniq_ptr_impl<client_socket,_std::default_delete<client_socket>_>._M_t
  .super__Tuple_impl<0UL,_client_socket_*,_std::default_delete<client_socket>_>.
  super__Head_base<0UL,_client_socket_*,_false>._M_head_impl = (client_socket *)0x0;
  this->response_size = 0;
  this->response_sent = 0;
  return;
}

Assistant:

http_server::inbound_connection::inbound_connection(http_server* parent)
    : parent(parent)
    , socket(parent->ss.accept([this] {
        this->parent->connections.erase(this);
    }, [this] {
        try_read();
    }, client_socket::on_ready_t{}))
    , timer(parent->ep.get_timer(), timeout, [this] {
        this->parent->connections.erase(this);
    })
    , request_received(0)
    , response_size(0)
    , response_sent(0)
{}